

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O0

int __thiscall cmExprParserHelper::LexInput(cmExprParserHelper *this,char *buf,int maxlen)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  int maxlen_local;
  char *buf_local;
  cmExprParserHelper *this_local;
  
  if (maxlen < 1) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = this->InputBufferPos;
    uVar2 = std::__cxx11::string::size();
    if (uVar1 < uVar2) {
      this->InputBufferPos = this->InputBufferPos + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->InputBuffer);
      *buf = *pcVar3;
      if (*buf == '\n') {
        this->CurrentLine = this->CurrentLine + 1;
      }
      this_local._4_4_ = 1;
    }
    else {
      *buf = '\n';
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmExprParserHelper::LexInput(char* buf, int maxlen)
{
  //std::cout << "JPLexInput ";
  //std::cout.write(buf, maxlen);
  //std::cout << std::endl;
  if ( maxlen < 1 )
    {
    return 0;
    }
  if ( this->InputBufferPos < this->InputBuffer.size() )
    {
    buf[0] = this->InputBuffer[ this->InputBufferPos++ ];
    if ( buf[0] == '\n' )
      {
      this->CurrentLine ++;
      }
    return(1);
    }
  else
    {
    buf[0] = '\n';
    return( 0 );
    }
}